

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checksum.c
# Opt level: O0

int ffcsum(fitsfile *fptr,long nrec,unsigned_long *sum,int *status)

{
  int *in_RCX;
  ulong *in_RDX;
  long in_RSI;
  unsigned_long locarry;
  unsigned_long hicarry;
  unsigned_long lo;
  unsigned_long hi;
  unsigned_short sbuf [1440];
  long jj;
  long ii;
  ulong local_b98;
  ulong local_b90;
  ulong in_stack_fffffffffffff478;
  short *in_stack_fffffffffffff480;
  ushort local_b78 [20];
  int *in_stack_fffffffffffff4b0;
  void *in_stack_fffffffffffff4b8;
  LONGLONG in_stack_fffffffffffff4c0;
  fitsfile *in_stack_fffffffffffff4c8;
  long local_38;
  long local_30;
  int local_4;
  
  if (*in_RCX < 1) {
    for (local_38 = 0; local_38 < in_RSI; local_38 = local_38 + 1) {
      ffgbyt(in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8,
             in_stack_fffffffffffff4b0);
      ffswap2(in_stack_fffffffffffff480,in_stack_fffffffffffff478);
      in_stack_fffffffffffff480 = (short *)(*in_RDX >> 0x10);
      in_stack_fffffffffffff478 = *in_RDX & 0xffff;
      for (local_30 = 0; local_30 < 0x5a0; local_30 = local_30 + 2) {
        in_stack_fffffffffffff480 =
             (short *)((ulong)local_b78[local_30] + (long)in_stack_fffffffffffff480);
        in_stack_fffffffffffff478 = local_b78[local_30 + 1] + in_stack_fffffffffffff478;
      }
      while( true ) {
        local_b90 = (ulong)in_stack_fffffffffffff480 >> 0x10;
        local_b98 = in_stack_fffffffffffff478 >> 0x10;
        if (local_b90 == 0 && local_b98 == 0) break;
        in_stack_fffffffffffff480 =
             (short *)(((ulong)in_stack_fffffffffffff480 & 0xffff) + local_b98);
        in_stack_fffffffffffff478 = (in_stack_fffffffffffff478 & 0xffff) + local_b90;
      }
      *in_RDX = (long)in_stack_fffffffffffff480 * 0x10000 + in_stack_fffffffffffff478;
    }
    local_4 = *in_RCX;
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffcsum(fitsfile *fptr,      /* I - FITS file pointer                  */
           long nrec,           /* I - number of 2880-byte blocks to sum  */
           unsigned long *sum,  /* IO - accumulated checksum              */
           int *status)         /* IO - error status                      */
/*
    Calculate a 32-bit 1's complement checksum of the FITS 2880-byte blocks.
    This routine is based on the C algorithm developed by Rob
    Seaman at NOAO that was presented at the 1994 ADASS conference,  
    published in the Astronomical Society of the Pacific Conference Series.
    This uses a 32-bit 1's complement checksum in which the overflow bits
    are permuted back into the sum and therefore all bit positions are
    sampled evenly. 
*/
{
    long ii, jj;
    unsigned short sbuf[1440];
    unsigned long hi, lo, hicarry, locarry;

    if (*status > 0)
        return(*status);
  /*
    Sum the specified number of FITS 2880-byte records.  This assumes that
    the FITSIO file pointer points to the start of the records to be summed.
    Read each FITS block as 1440 short values (do byte swapping if needed).
  */
    for (jj = 0; jj < nrec; jj++)
    {
      ffgbyt(fptr, 2880, sbuf, status);

#if BYTESWAPPED

      ffswap2( (short *)sbuf, 1440); /* reverse order of bytes in each value */

#endif

      hi = (*sum >> 16);
      lo = *sum & 0xFFFF;

      for (ii = 0; ii < 1440; ii += 2)
      {
        hi += sbuf[ii];
        lo += sbuf[ii+1];
      }

      hicarry = hi >> 16;    /* fold carry bits in */
      locarry = lo >> 16;

      while (hicarry | locarry)
      {
        hi = (hi & 0xFFFF) + locarry;
        lo = (lo & 0xFFFF) + hicarry;
        hicarry = hi >> 16;
        locarry = lo >> 16;
      }

      *sum = (hi << 16) + lo;
    }
    return(*status);
}